

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

char * qpdf_oh_get_name(qpdf_data qpdf,qpdf_oh oh)

{
  char *pcVar1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  char *local_10;
  
  local_30._M_unused._M_object = &local_10;
  local_10 = "";
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<const_char_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<const_char_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<const_char_*(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1286:46)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<const_char_*(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1286:46)>
             ::_M_manager;
  local_50._M_unused._M_object = qpdf;
  pcVar1 = do_with_oh<char_const*>
                     (qpdf,oh,(function<const_char_*()> *)&local_30,
                      (function<const_char_*(QPDFObjectHandle_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return pcVar1;
}

Assistant:

char const*
qpdf_oh_get_name(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<char const*>(
        qpdf, oh, return_T<char const*>(""), [qpdf](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_name");
            qpdf->tmp_string = o.getName();
            return qpdf->tmp_string.c_str();
        });
}